

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.h
# Opt level: O0

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                   (string *__return_storage_ptr__,EnumValueDescriptor *descriptor,
                   FileDescriptor *file,bool preSpace,bool postNewline)

{
  EnumValueOptions *this;
  FileOptions *this_00;
  string *psVar1;
  allocator local_12a;
  allocator local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  FileDescriptor *local_50;
  FileDescriptor *sourceFile;
  string message;
  bool isFileLevelDeprecation;
  bool isDeprecated;
  bool postNewline_local;
  bool preSpace_local;
  FileDescriptor *file_local;
  EnumValueDescriptor *descriptor_local;
  string *result;
  
  message.field_2._M_local_buf[0xe] = postNewline;
  message.field_2._M_local_buf[0xf] = preSpace;
  this = EnumValueDescriptor::options(descriptor);
  message.field_2._M_local_buf[0xd] = EnumValueOptions::deprecated(this);
  message.field_2._M_local_buf[0xc] = '\0';
  if ((!(bool)message.field_2._M_local_buf[0xd]) && (file != (FileDescriptor *)0x0)) {
    this_00 = FileDescriptor::options(file);
    message.field_2._M_local_buf[0xc] = FileOptions::deprecated(this_00);
    message.field_2._M_local_buf[0xd] = message.field_2._M_local_buf[0xc];
  }
  if (message.field_2._M_local_buf[0xd] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_12a);
    std::allocator<char>::~allocator((allocator<char> *)&local_12a);
  }
  else {
    std::__cxx11::string::string((string *)&sourceFile);
    local_50 = EnumValueDescriptor::file(descriptor);
    if ((message.field_2._M_local_buf[0xc] & 1U) == 0) {
      psVar1 = EnumValueDescriptor::full_name_abi_cxx11_(descriptor);
      std::operator+(&local_e0,psVar1," is deprecated (see ");
      psVar1 = FileDescriptor::name_abi_cxx11_(local_50);
      std::operator+(&local_c0,&local_e0,psVar1);
      std::operator+(&local_a0,&local_c0,").");
      std::__cxx11::string::operator=((string *)&sourceFile,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      psVar1 = FileDescriptor::name_abi_cxx11_(local_50);
      std::operator+(&local_80,psVar1," is deprecated.");
      std::__cxx11::string::operator=((string *)&sourceFile,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    local_e1 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"GPB_DEPRECATED_MSG(\"",&local_129);
    std::operator+(&local_108,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sourceFile)
    ;
    std::operator+(__return_storage_ptr__,&local_108,"\")");
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    if ((message.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)0x0);
    }
    if ((message.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    local_e1 = 1;
    std::__cxx11::string::~string((string *)&sourceFile);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetOptionalDeprecatedAttribute(const TDescriptor* descriptor,
                                           const FileDescriptor* file = NULL,
                                           bool preSpace = true,
                                           bool postNewline = false) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  bool isFileLevelDeprecation = false;
  if (!isDeprecated && file) {
    isFileLevelDeprecation = file->options().deprecated();
    isDeprecated = isFileLevelDeprecation;
  }
  if (isDeprecated) {
    std::string message;
    const FileDescriptor* sourceFile = descriptor->file();
    if (isFileLevelDeprecation) {
      message = sourceFile->name() + " is deprecated.";
    } else {
      message = descriptor->full_name() + " is deprecated (see " +
                sourceFile->name() + ").";
    }

    std::string result = std::string("GPB_DEPRECATED_MSG(\"") + message + "\")";
    if (preSpace) {
      result.insert(0, " ");
    }
    if (postNewline) {
      result.append("\n");
    }
    return result;
  } else {
    return "";
  }
}